

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_Show6VarFunc(word F0,word F1)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  
  if ((F1 & F0) == 0) {
    iVar3 = 4;
    do {
      putchar(0x20);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    putchar(0x20);
    lVar4 = 0;
    do {
      uVar1 = (&DAT_00824b40)[lVar4];
      uVar7 = 2;
      do {
        printf("%d",(ulong)((uVar1 >> (uVar7 & 0x1f) & 1) != 0));
        bVar8 = uVar7 != 0;
        uVar7 = uVar7 - 1;
      } while (bVar8);
      putchar(0x20);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    putchar(10);
    iVar3 = 4;
    do {
      putchar(0x20);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    putchar(0x2b);
    iVar3 = 0;
    do {
      iVar6 = 3;
      do {
        putchar(0x2d);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      putchar(0x2b);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 8);
    putchar(10);
    lVar4 = 0;
    do {
      uVar1 = (&DAT_00824b40)[lVar4];
      uVar7 = 2;
      do {
        printf("%d",(ulong)((uVar1 >> (uVar7 & 0x1f) & 1) != 0));
        bVar8 = uVar7 != 0;
        uVar7 = uVar7 - 1;
      } while (bVar8);
      printf(" |");
      lVar5 = 0;
      do {
        iVar3 = 0x20;
        putchar(0x20);
        uVar2 = (ulong)(uint)((&DAT_00824b40)[lVar4] * 8 + *(int *)((long)&DAT_00824b40 + lVar5));
        if ((F1 >> (uVar2 & 0x3f) & 1) != 0) {
          iVar3 = 0x31;
        }
        if ((F0 >> (uVar2 & 0x3f) & 1) != 0) {
          iVar3 = 0x30;
        }
        putchar(iVar3);
        printf(" |");
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x20);
      putchar(10);
      iVar3 = 4;
      do {
        putchar(0x20);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      putchar(0x2b);
      iVar3 = 0;
      do {
        iVar6 = 3;
        do {
          putchar(0x2d);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
        iVar6 = 0x7c;
        if (iVar3 == 7) {
          iVar6 = 0x2b;
        }
        if (lVar4 == 7) {
          iVar6 = 0x2b;
        }
        putchar(iVar6);
        iVar3 = iVar3 + 1;
      } while (iVar3 != 8);
      putchar(10);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    return;
  }
  __assert_fail("(F0 & F1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPrint.c"
                ,0x700,"void Abc_Show6VarFunc(word, word)");
}

Assistant:

void Abc_Show6VarFunc( word F0, word F1 )
{
    // order of cells in the Karnaugh map
//    int Cells[8] = { 0, 1, 3, 2, 6, 7, 5, 4 };
    int Cells[8] = { 0, 4, 6, 2, 3, 7, 5, 1 };
    // intermediate variables
    int s; // symbol counter
    int h; // horizontal coordinate;
    int v; // vertical coordinate;
    assert( (F0 & F1) == 0 );

    // output minterms above
    for ( s = 0; s < 4; s++ )
        printf( " " );
    printf( " " );
    for ( h = 0; h < 8; h++ )
    {
        for ( s = 0; s < 3; s++ )
            printf( "%d",  ((Cells[h] >> (2-s)) & 1) );
        printf( " " );
    }
    printf( "\n" );

    // output horizontal line above
    for ( s = 0; s < 4; s++ )
        printf( " " );
    printf( "+" );
    for ( h = 0; h < 8; h++ )
    {
        for ( s = 0; s < 3; s++ )
            printf( "-" );
        printf( "+" );
    }
    printf( "\n" );

    // output lines with function values
    for ( v = 0; v < 8; v++ )
    {
        for ( s = 0; s < 3; s++ )
            printf( "%d",  ((Cells[v] >> (2-s)) & 1) );
        printf( " |" );

        for ( h = 0; h < 8; h++ )
        {
            printf( " " );
            if ( ((F0 >> ((Cells[v]*8)+Cells[h])) & 1) )
                printf( "0" );
            else if ( ((F1 >> ((Cells[v]*8)+Cells[h])) & 1) )
                printf( "1" );
            else
                printf( " " );
            printf( " |" );
        }
        printf( "\n" );

        // output horizontal line above
        for ( s = 0; s < 4; s++ )
            printf( " " );
//        printf( "%c", v == 7 ? '+' : '|' );
        printf( "+" );
        for ( h = 0; h < 8; h++ )
        {
            for ( s = 0; s < 3; s++ )
                printf( "-" );
//            printf( "%c", v == 7 ? '+' : '|' );
            printf( "%c", (v == 7 || h == 7) ? '+' : '|' );
        }
        printf( "\n" );
    }
}